

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

void stringcache_destroy(StringCache *cache)

{
  MOJOSHADER_free p_Var1;
  void *pvVar2;
  StringBucket *pSVar3;
  StringBucket *next;
  StringBucket *bucket;
  size_t i;
  void *d;
  MOJOSHADER_free f;
  StringCache *cache_local;
  
  if (cache != (StringCache *)0x0) {
    p_Var1 = cache->f;
    pvVar2 = cache->d;
    for (bucket = (StringBucket *)0x0; bucket < (StringBucket *)(ulong)cache->table_size;
        bucket = (StringBucket *)((long)&bucket->string + 1)) {
      next = cache->hashtable[(long)bucket];
      cache->hashtable[(long)bucket] = (StringBucket *)0x0;
      while (next != (StringBucket *)0x0) {
        pSVar3 = next->next;
        (*p_Var1)(next,pvVar2);
        next = pSVar3;
      }
    }
    (*p_Var1)(cache->hashtable,pvVar2);
    (*p_Var1)(cache,pvVar2);
  }
  return;
}

Assistant:

void stringcache_destroy(StringCache *cache)
{
    if (cache == NULL)
        return;

    MOJOSHADER_free f = cache->f;
    void *d = cache->d;
    size_t i;

    for (i = 0; i < cache->table_size; i++)
    {
        StringBucket *bucket = cache->hashtable[i];
        cache->hashtable[i] = NULL;
        while (bucket)
        {
            StringBucket *next = bucket->next;
            f(bucket, d);
            bucket = next;
        } // while
    } // for

    f(cache->hashtable, d);
    f(cache, d);
}